

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::Result(XmlReporter *this,AssertionResult *assertionResult)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IConfig *pIVar2;
  pointer pcVar3;
  int iVar4;
  OfType OVar5;
  XmlWriter *pXVar6;
  XmlWriter *pXVar7;
  ScopedElement scoped;
  ScopedElement scoped_3;
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  size_t local_c8;
  string local_c0;
  size_t local_a0;
  ScopedElement local_98;
  string local_90;
  string local_70;
  string local_50;
  
  pIVar2 = (this->m_config).m_fullConfig.m_p;
  if (pIVar2 != (IConfig *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar2);
  }
  iVar4 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[7])(pIVar2);
  if ((char)iVar4 == '\0') {
    OVar5 = (assertionResult->m_resultData).resultType;
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(pIVar2);
    if (OVar5 == Ok) {
      return;
    }
  }
  else {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])(pIVar2);
  }
  if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
    OVar5 = (assertionResult->m_resultData).resultType;
  }
  else {
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Expression","");
    pXVar7 = &this->m_xml;
    pXVar6 = XmlWriter::startElement(pXVar7,(string *)local_108);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"success","");
    pXVar6 = XmlWriter::writeAttribute
                       (pXVar6,&local_70,
                        ((assertionResult->m_resultData).resultType & FailureBit) == Ok);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"filename","");
    local_e8._0_8_ = local_e8 + 0x10;
    pcVar3 = (assertionResult->m_info).lineInfo.file._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,pcVar3,
               pcVar3 + (assertionResult->m_info).lineInfo.file._M_string_length);
    local_c8 = (assertionResult->m_info).lineInfo.line;
    pXVar6 = XmlWriter::writeAttribute(pXVar6,&local_90,(string *)local_e8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"line","");
    paVar1 = &local_c0.field_2;
    pcVar3 = (assertionResult->m_info).lineInfo.file._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,
               pcVar3 + (assertionResult->m_info).lineInfo.file._M_string_length);
    local_a0 = (assertionResult->m_info).lineInfo.line;
    XmlWriter::writeAttribute<unsigned_long>(pXVar6,&local_50,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pXVar6 = (XmlWriter *)(local_e8 + 0x10);
    if ((XmlWriter *)local_e8._0_8_ != pXVar6) {
      operator_delete((void *)local_e8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_);
    }
    local_e8._0_8_ = pXVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Original","");
    local_108._0_8_ = pXVar7;
    XmlWriter::startElement(pXVar7,(string *)local_e8);
    AssertionResult::getExpression_abi_cxx11_(&local_c0,assertionResult);
    XmlWriter::writeText((XmlWriter *)local_108._0_8_,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_108);
    if ((XmlWriter *)local_e8._0_8_ != pXVar6) {
      operator_delete((void *)local_e8._0_8_);
    }
    local_e8._0_8_ = pXVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Expanded","");
    local_108._0_8_ = pXVar7;
    XmlWriter::startElement(pXVar7,(string *)local_e8);
    pcVar3 = (assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,
               pcVar3 + (assertionResult->m_resultData).reconstructedExpression._M_string_length);
    XmlWriter::writeText((XmlWriter *)local_108._0_8_,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_108);
    if ((XmlWriter *)local_e8._0_8_ != pXVar6) {
      operator_delete((void *)local_e8._0_8_);
    }
    OVar5 = (assertionResult->m_resultData).resultType;
    this->m_currentTestSuccess = (bool)(this->m_currentTestSuccess & (OVar5 & FailureBit) == Ok);
  }
  if (OVar5 < ExplicitFailure) {
    if (OVar5 == Info) {
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Info","");
      local_108._0_8_ = &this->m_xml;
      XmlWriter::startElement((XmlWriter *)local_108._0_8_,(string *)local_e8);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar3,
                 pcVar3 + (assertionResult->m_resultData).message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_108._0_8_,&local_c0,true);
    }
    else {
      if (OVar5 != Warning) goto LAB_001369c1;
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Warning","");
      local_108._0_8_ = &this->m_xml;
      XmlWriter::startElement((XmlWriter *)local_108._0_8_,(string *)local_e8);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar3,
                 pcVar3 + (assertionResult->m_resultData).message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_108._0_8_,&local_c0,true);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_108);
    if ((XmlWriter *)local_e8._0_8_ != (XmlWriter *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_);
    }
    goto LAB_001369c1;
  }
  if (OVar5 == ExplicitFailure) {
    local_e8._0_8_ = (XmlWriter *)(local_e8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Failure","");
    local_108._0_8_ = &this->m_xml;
    XmlWriter::startElement((XmlWriter *)local_108._0_8_,(string *)local_e8);
    pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,
               pcVar3 + (assertionResult->m_resultData).message._M_string_length);
    XmlWriter::writeText((XmlWriter *)local_108._0_8_,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_108);
    pXVar7 = (XmlWriter *)local_e8._0_8_;
    if ((XmlWriter *)local_e8._0_8_ != (XmlWriter *)(local_e8 + 0x10)) {
LAB_001369b8:
      operator_delete(pXVar7);
    }
  }
  else {
    if (OVar5 != ThrewException) goto LAB_001369c1;
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Exception","");
    local_98.m_writer = &this->m_xml;
    XmlWriter::startElement(local_98.m_writer,(string *)local_108);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"filename","");
    pcVar3 = (assertionResult->m_info).lineInfo.file._M_dataplus._M_p;
    local_e8._0_8_ = (XmlWriter *)(local_e8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,pcVar3,
               pcVar3 + (assertionResult->m_info).lineInfo.file._M_string_length);
    local_c8 = (assertionResult->m_info).lineInfo.line;
    XmlWriter::writeAttribute(local_98.m_writer,&local_70,(string *)local_e8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"line","");
    pcVar3 = (assertionResult->m_info).lineInfo.file._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,
               pcVar3 + (assertionResult->m_info).lineInfo.file._M_string_length);
    local_a0 = (assertionResult->m_info).lineInfo.line;
    XmlWriter::writeAttribute<unsigned_long>(local_98.m_writer,&local_90,&local_a0);
    pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,
               pcVar3 + (assertionResult->m_resultData).message._M_string_length);
    XmlWriter::writeText(local_98.m_writer,&local_50,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((XmlWriter *)local_e8._0_8_ != (XmlWriter *)(local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_98);
    pXVar7 = (XmlWriter *)local_108._0_8_;
    if ((XmlWriter *)local_108._0_8_ != (XmlWriter *)(local_108 + 0x10)) goto LAB_001369b8;
  }
  this->m_currentTestSuccess = false;
LAB_001369c1:
  if ((assertionResult->m_info).capturedExpression._M_string_length != 0) {
    XmlWriter::endElement(&this->m_xml);
  }
  return;
}

Assistant:

virtual void Result( const Catch::AssertionResult& assertionResult ) {
            if( !m_config.fullConfig()->includeSuccessfulResults() && assertionResult.getResultType() == ResultWas::Ok )
                return;

            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
                m_currentTestSuccess &= assertionResult.succeeded();
            }

            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    m_currentTestSuccess = false;
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    m_xml.scopedElement( "Warning" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    m_currentTestSuccess = false;
                    break;
                case ResultWas::Unknown:
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                case ResultWas::DidntThrowException:
                    break;
            }
            if( assertionResult.hasExpression() )
                m_xml.endElement();
        }